

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vgbm(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint uVar1;
  int iVar2;
  uint32_t dofs;
  uint64_t uVar3;
  TCGv_i64 ret;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_i2,FLD_C_b2);
  if ((uVar1 & 0xffff) == (uVar1 & 0xff) * 0x101) {
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    dofs = vec_full_reg_offset((uint8_t)iVar2);
    uVar3 = generate_byte_mask((uint8_t)uVar1);
    tcg_gen_gvec_dup64i_s390x(tcg_ctx,dofs,0x10,0x10,uVar3);
  }
  else {
    ret = tcg_temp_new_i64(tcg_ctx);
    uVar3 = generate_byte_mask((uint8_t)(uVar1 >> 8));
    tcg_gen_movi_i64_s390x(tcg_ctx,ret,uVar3);
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    write_vec_element_i64(tcg_ctx,ret,iVar2,'\0',MO_64);
    uVar3 = generate_byte_mask((uint8_t)uVar1);
    tcg_gen_movi_i64_s390x(tcg_ctx,ret,uVar3);
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    write_vec_element_i64(tcg_ctx,ret,iVar2,'\x01',MO_64);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_vgbm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint16_t i2 = get_field(s, i2);

    if (i2 == (i2 & 0xff) * 0x0101) {
        /*
         * Masks for both 64 bit elements of the vector are the same.
         * Trust tcg to produce a good constant loading.
         */
        gen_gvec_dup64i(tcg_ctx, get_field(s, v1),
                        generate_byte_mask(i2 & 0xff));
    } else {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_movi_i64(tcg_ctx, t, generate_byte_mask(i2 >> 8));
        write_vec_element_i64(tcg_ctx, t, get_field(s, v1), 0, ES_64);
        tcg_gen_movi_i64(tcg_ctx, t, generate_byte_mask(i2));
        write_vec_element_i64(tcg_ctx, t, get_field(s, v1), 1, ES_64);
        tcg_temp_free_i64(tcg_ctx, t);
    }
    return DISAS_NEXT;
}